

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

void Cec3_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,bmcg_sat_solver *pSat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *plits;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int local_4c;
  int i;
  int RetValue;
  int nLits;
  int *pLits;
  Gia_Obj_t *pFanin;
  int fPolarFlip;
  bmcg_sat_solver *pSat_local;
  Vec_Ptr_t *vSuper_local;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                  ,0xeb,
                  "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                 );
  }
  iVar1 = Gia_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                  ,0xec,
                  "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                 );
  }
  iVar1 = Vec_PtrSize(vSuper);
  plits = (int *)malloc((long)(iVar1 + 1) << 2);
  for (local_4c = 0; iVar2 = Vec_PtrSize(vSuper), local_4c < iVar2; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vSuper,local_4c);
    pGVar5 = Gia_Regular(pGVar4);
    iVar2 = Cec3_ObjSatId(p,pGVar5);
    iVar3 = Gia_IsComplement(pGVar4);
    iVar2 = Abc_Var2Lit(iVar2,iVar3);
    *plits = iVar2;
    iVar2 = Cec3_ObjSatId(p,pNode);
    iVar2 = Abc_Var2Lit(iVar2,1);
    plits[1] = iVar2;
    iVar2 = bmcg_sat_solver_addclause(pSat,plits,2);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                    ,0xfc,
                    "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                   );
    }
  }
  for (local_4c = 0; iVar2 = Vec_PtrSize(vSuper), local_4c < iVar2; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vSuper,local_4c);
    pGVar5 = Gia_Regular(pGVar4);
    iVar2 = Cec3_ObjSatId(p,pGVar5);
    iVar3 = Gia_IsComplement(pGVar4);
    iVar2 = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    plits[local_4c] = iVar2;
  }
  iVar2 = Cec3_ObjSatId(p,pNode);
  iVar2 = Abc_Var2Lit(iVar2,0);
  plits[iVar1] = iVar2;
  iVar1 = bmcg_sat_solver_addclause(pSat,plits,iVar1 + 1);
  if (iVar1 != 0) {
    if (plits != (int *)0x0) {
      free(plits);
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                ,0x10d,
                "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
               );
}

Assistant:

void Cec3_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, bmcg_sat_solver * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec3_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec3_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = bmcg_sat_solver_addclause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec3_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec3_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = bmcg_sat_solver_addclause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}